

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  huff_entropy_ptr_conflict entropy_00;
  int *piVar3;
  int iVar4;
  int absvalues [64];
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  uint BR;
  char *BR_buffer;
  int EOB;
  int k;
  int r;
  int temp;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  entropy_00 = (huff_entropy_ptr_conflict)cinfo->entropy;
  entropy_00->next_output_byte = cinfo->dest->next_output_byte;
  entropy_00->free_in_buffer = cinfo->dest->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy_00->restarts_to_go == 0)) {
    emit_restart_e(entropy_00,entropy_00->next_restart_num);
  }
  iVar1 = cinfo->Se;
  iVar2 = cinfo->Al;
  piVar3 = cinfo->natural_order;
  absvalues._248_8_ = *MCU_data;
  BR_buffer._0_4_ = 0;
  for (BR_buffer._4_4_ = cinfo->Ss; BR_buffer._4_4_ <= iVar1; BR_buffer._4_4_ = BR_buffer._4_4_ + 1)
  {
    k = (int)*(short *)(absvalues._248_8_ + (long)piVar3[BR_buffer._4_4_] * 2);
    if (k < 0) {
      k = -k;
    }
    iVar4 = k >> ((byte)iVar2 & 0x1f);
    absvalues[(long)BR_buffer._4_4_ + -2] = iVar4;
    if (iVar4 == 1) {
      BR_buffer._0_4_ = BR_buffer._4_4_;
    }
  }
  EOB = 0;
  Al = 0;
  _Se = entropy_00->bit_buffer + entropy_00->BE;
  for (BR_buffer._4_4_ = cinfo->Ss; BR_buffer._4_4_ <= iVar1; BR_buffer._4_4_ = BR_buffer._4_4_ + 1)
  {
    iVar2 = absvalues[(long)BR_buffer._4_4_ + -2];
    if (iVar2 == 0) {
      EOB = EOB + 1;
    }
    else {
      while (0xf < EOB && BR_buffer._4_4_ <= (int)BR_buffer) {
        emit_eobrun(entropy_00);
        emit_ac_symbol(entropy_00,entropy_00->ac_tbl_no,0xf0);
        EOB = EOB + -0x10;
        emit_buffered_bits(entropy_00,_Se,Al);
        _Se = entropy_00->bit_buffer;
        Al = 0;
      }
      if (iVar2 < 2) {
        emit_eobrun(entropy_00);
        emit_ac_symbol(entropy_00,entropy_00->ac_tbl_no,EOB * 0x10 + 1);
        emit_bits_e(entropy_00,
                    (uint)(-1 < *(short *)(absvalues._248_8_ + (long)piVar3[BR_buffer._4_4_] * 2)),1
                   );
        emit_buffered_bits(entropy_00,_Se,Al);
        _Se = entropy_00->bit_buffer;
        Al = 0;
        EOB = 0;
      }
      else {
        _Se[(uint)Al] = (byte)iVar2 & 1;
        Al = Al + 1;
      }
    }
  }
  if ((0 < EOB) || (Al != 0)) {
    entropy_00->EOBRUN = entropy_00->EOBRUN + 1;
    entropy_00->BE = Al + entropy_00->BE;
    if ((entropy_00->EOBRUN == 0x7fff) || (0x3a9 < entropy_00->BE)) {
      emit_eobrun(entropy_00);
    }
  }
  cinfo->dest->next_output_byte = entropy_00->next_output_byte;
  cinfo->dest->free_in_buffer = entropy_00->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy_00->restarts_to_go == 0) {
      entropy_00->restarts_to_go = cinfo->restart_interval;
      entropy_00->next_restart_num = entropy_00->next_restart_num + 1;
      entropy_00->next_restart_num = entropy_00->next_restart_num & 7;
    }
    entropy_00->restarts_to_go = entropy_00->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp;
  register int r, k;
  int EOB;
  char *BR_buffer;
  unsigned int BR;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  int absvalues[DCTSIZE2];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* It is convenient to make a pre-pass to determine the transformed
   * coefficients' absolute values and the EOB position.
   */
  EOB = 0;
  for (k = cinfo->Ss; k <= Se; k++) {
    temp = (*block)[natural_order[k]];
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if (temp < 0)
      temp = -temp;		/* temp is abs value of input */
    temp >>= Al;		/* apply the point transform */
    absvalues[k] = temp;	/* save abs value for main pass */
    if (temp == 1)
      EOB = k;			/* EOB = index of last newly-nonzero coef */
  }

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */
  
  r = 0;			/* r = run length of zeros */
  BR = 0;			/* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = absvalues[k]) == 0) {
      r++;
      continue;
    }

    /* Emit any required ZRLs, but not if they can be folded into EOB */
    while (r > 15 && k <= EOB) {
      /* emit any pending EOBRUN and the BE correction bits */
      emit_eobrun(entropy);
      /* Emit ZRL */
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
      /* Emit buffered correction bits that must be associated with ZRL */
      emit_buffered_bits(entropy, BR_buffer, BR);
      BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
      BR = 0;
    }

    /* If the coef was previously nonzero, it only needs a correction bit.
     * NOTE: a straight translation of the spec's figure G.7 would suggest
     * that we also need to test r > 15.  But if r > 15, we can only get here
     * if k > EOB, which implies that this coefficient is not 1.
     */
    if (temp > 1) {
      /* The correction bit is the next bit of the absolute value. */
      BR_buffer[BR++] = (char) (temp & 1);
      continue;
    }

    /* Emit any pending EOBRUN and the BE correction bits */
    emit_eobrun(entropy);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + 1);

    /* Emit output bit for newly-nonzero coef */
    temp = ((*block)[natural_order[k]] < 0) ? 0 : 1;
    emit_bits_e(entropy, (unsigned int) temp, 1);

    /* Emit buffered correction bits that must be associated with this code */
    emit_buffered_bits(entropy, BR_buffer, BR);
    BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
    BR = 0;
    r = 0;			/* reset zero run length */
  }

  if (r > 0 || BR > 0) {	/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    entropy->BE += BR;		/* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF || entropy->BE > (MAX_CORR_BITS-DCTSIZE2+1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}